

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_search.c
# Opt level: O0

REF_STATUS ref_search_stats(REF_SEARCH ref_search)

{
  uint local_24;
  uint local_20;
  REF_INT zero;
  REF_INT one;
  REF_INT two;
  REF_INT empty;
  REF_INT i;
  REF_SEARCH ref_search_local;
  
  one = 0;
  zero = 0;
  local_20 = 0;
  local_24 = 0;
  for (two = 0; two < ref_search->n; two = two + 1) {
    if (ref_search->item[two] == -1) {
      one = one + 1;
    }
    else if ((ref_search->left[two] == -1) && (ref_search->right[two] == -1)) {
      local_24 = local_24 + 1;
    }
    else if ((ref_search->left[two] == -1) || (ref_search->right[two] == -1)) {
      local_20 = local_20 + 1;
    }
    else {
      zero = zero + 1;
    }
  }
  printf("n %d empty %d zero %d one %d two %d\n",(ulong)(uint)ref_search->n,(ulong)(uint)one,
         (ulong)local_24,(ulong)local_20,(ulong)(uint)zero);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_search_stats(REF_SEARCH ref_search) {
  REF_INT i, empty, two, one, zero;
  empty = 0;
  two = 0;
  one = 0;
  zero = 0;
  for (i = 0; i < ref_search->n; i++) {
    if (REF_EMPTY == ref_search->item[i]) {
      empty += 1;
      continue;
    }
    if (REF_EMPTY == ref_search->left[i] && REF_EMPTY == ref_search->right[i]) {
      zero += 1;
      continue;
    }
    if (REF_EMPTY != ref_search->left[i] && REF_EMPTY != ref_search->right[i]) {
      two += 1;
      continue;
    }
    one += 1;
  }
  printf("n %d empty %d zero %d one %d two %d\n", ref_search->n, empty, zero,
         one, two);

  return REF_SUCCESS;
}